

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O3

void bcf_enc_int1(kstring_t *s,int32_t x)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (x == -0x7fffffff) {
    sVar3 = s->l;
    uVar1 = sVar3 + 1;
    if (uVar1 < s->m) {
      pcVar2 = s->s;
LAB_0011c2dc:
      s->l = uVar1;
      pcVar2[sVar3] = '\x11';
      s->s[s->l] = '\0';
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        sVar3 = s->l;
        uVar1 = sVar3 + 1;
        goto LAB_0011c2dc;
      }
    }
    sVar3 = s->l;
    uVar1 = sVar3 + 1;
    if (uVar1 < s->m) {
      pcVar2 = s->s;
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
      sVar3 = s->l;
      uVar1 = sVar3 + 1;
    }
    s->l = uVar1;
    pcVar2[sVar3] = -0x7f;
  }
  else {
    if (0xfe < x + 0x7fU) {
      if (x + 0x7fffU < 0xffff) {
        sVar3 = s->l;
        uVar1 = sVar3 + 1;
        if (uVar1 < s->m) {
          pcVar2 = s->s;
LAB_0011c5b0:
          s->l = uVar1;
          pcVar2[sVar3] = '\x12';
          s->s[s->l] = '\0';
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            sVar3 = s->l;
            uVar1 = sVar3 + 1;
            goto LAB_0011c5b0;
          }
        }
        sVar3 = s->l;
        uVar1 = sVar3 + 3;
        if (uVar1 < s->m) {
          pcVar2 = s->s;
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
          sVar3 = s->l;
        }
        *(short *)(pcVar2 + sVar3) = (short)x;
        sVar3 = s->l + 2;
      }
      else {
        sVar3 = s->l;
        uVar1 = sVar3 + 1;
        if (uVar1 < s->m) {
          pcVar2 = s->s;
LAB_0011c62d:
          s->l = uVar1;
          pcVar2[sVar3] = '\x13';
          s->s[s->l] = '\0';
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            sVar3 = s->l;
            uVar1 = sVar3 + 1;
            goto LAB_0011c62d;
          }
        }
        sVar3 = s->l;
        uVar1 = sVar3 + 5;
        if (uVar1 < s->m) {
          pcVar2 = s->s;
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
          sVar3 = s->l;
        }
        *(int32_t *)(pcVar2 + sVar3) = x;
        sVar3 = s->l + 4;
      }
      s->l = sVar3;
      pcVar2 = s->s + sVar3;
      goto LAB_0011c554;
    }
    sVar3 = s->l;
    uVar1 = sVar3 + 1;
    if (uVar1 < s->m) {
      pcVar2 = s->s;
LAB_0011c4b6:
      s->l = uVar1;
      pcVar2[sVar3] = '\x11';
      s->s[s->l] = '\0';
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        sVar3 = s->l;
        uVar1 = sVar3 + 1;
        goto LAB_0011c4b6;
      }
    }
    sVar3 = s->l;
    uVar1 = sVar3 + 1;
    if (uVar1 < s->m) {
      pcVar2 = s->s;
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
      sVar3 = s->l;
      uVar1 = sVar3 + 1;
    }
    s->l = uVar1;
    pcVar2[sVar3] = (char)x;
  }
  pcVar2 = s->s + s->l;
LAB_0011c554:
  *pcVar2 = '\0';
  return;
}

Assistant:

static inline void bcf_enc_int1(kstring_t *s, int32_t x)
{
    if (x == bcf_int32_vector_end) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_vector_end, s);
    } else if (x == bcf_int32_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_missing, s);
    } else if (x <= INT8_MAX && x > bcf_int8_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(x, s);
    } else if (x <= INT16_MAX && x > bcf_int16_missing) {
        int16_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT16);
        kputsn((char*)&z, 2, s);
    } else {
        int32_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT32);
        kputsn((char*)&z, 4, s);
    }
}